

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Disk * pbrt::Disk::Create(Transform *renderFromObject,Transform *objectFromRender,
                         bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,
                         Allocator alloc)

{
  Disk *pDVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  byte in_DL;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float phimax;
  Float innerRadius;
  Float radius;
  Float height;
  string *in_stack_fffffffffffffea8;
  ParameterDictionary *in_stack_fffffffffffffeb0;
  allocator<char> *args_4;
  undefined4 in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffff00;
  allocator<char> local_e1;
  string local_e0 [32];
  Float local_c0;
  allocator<char> local_b9;
  string local_b8 [32];
  Float local_98;
  allocator<char> local_91;
  string local_90 [32];
  Float local_70;
  allocator<char> local_59;
  string local_58 [36];
  Float local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  byte local_19;
  
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  FVar2 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  this = local_28;
  local_34 = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  FVar3 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  __a = &local_b9;
  local_70 = FVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar3,in_stack_fffffffffffffee8),__a);
  FVar4 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  args_4 = &local_e1;
  local_98 = FVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar3,in_stack_fffffffffffffee8),__a);
  FVar5 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  local_c0 = FVar5;
  pDVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::Disk,pbrt::Transform_const*&,pbrt::Transform_const*&,bool&,float&,float&,float&,float&>
                     ((polymorphic_allocator<std::byte> *)this,
                      (Transform **)CONCAT44(FVar3,in_stack_fffffffffffffee8),(Transform **)__a,
                      (bool *)local_28,(float *)CONCAT44(FVar4,in_stack_fffffffffffffed0),
                      (float *)args_4,(float *)CONCAT44(FVar2,in_stack_ffffffffffffff00),
                      (float *)in_RCX);
  return pDVar1;
}

Assistant:

Disk *Disk::Create(const Transform *renderFromObject, const Transform *objectFromRender,
                   bool reverseOrientation, const ParameterDictionary &parameters,
                   const FileLoc *loc, Allocator alloc) {
    Float height = parameters.GetOneFloat("height", 0.);
    Float radius = parameters.GetOneFloat("radius", 1);
    Float innerRadius = parameters.GetOneFloat("innerradius", 0);
    Float phimax = parameters.GetOneFloat("phimax", 360);
    return alloc.new_object<Disk>(renderFromObject, objectFromRender, reverseOrientation,
                                  height, radius, innerRadius, phimax);
}